

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result wabt::interp::ReadBinaryInterp
                 (void *data,size_t size,ReadBinaryOptions *options,Errors *errors,
                 ModuleDesc *out_module)

{
  Result RVar1;
  BinaryReaderInterp reader;
  Features local_3c0;
  BinaryReaderInterp local_3b0;
  
  local_3b0.super_BinaryReaderNop.super_BinaryReaderDelegate.state = (State *)0x0;
  local_3b0.super_BinaryReaderNop.super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderInterp_001eff28;
  local_3b0.istream_ = &out_module->istream;
  local_3c0.bulk_memory_enabled_ = (options->features).bulk_memory_enabled_;
  local_3c0.reference_types_enabled_ = (options->features).reference_types_enabled_;
  local_3c0.annotations_enabled_ = (options->features).annotations_enabled_;
  local_3c0.gc_enabled_ = (options->features).gc_enabled_;
  local_3c0.exceptions_enabled_ = (options->features).exceptions_enabled_;
  local_3c0.mutable_globals_enabled_ = (options->features).mutable_globals_enabled_;
  local_3c0.sat_float_to_int_enabled_ = (options->features).sat_float_to_int_enabled_;
  local_3c0.sign_extension_enabled_ = (options->features).sign_extension_enabled_;
  local_3c0.simd_enabled_ = (options->features).simd_enabled_;
  local_3c0.threads_enabled_ = (options->features).threads_enabled_;
  local_3c0.multi_value_enabled_ = (options->features).multi_value_enabled_;
  local_3c0.tail_call_enabled_ = (options->features).tail_call_enabled_;
  local_3b0.errors_ = errors;
  local_3b0.module_ = out_module;
  SharedValidator::SharedValidator(&local_3b0.validator_,errors,(ValidateOptions *)&local_3c0);
  local_3b0.label_stack_.
  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.label_stack_.
  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0.label_stack_.
  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3b0.func_types_.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.func_types_.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0.func_types_.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.table_types_.
  super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.table_types_.
  super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0.table_types_.
  super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.memory_types_.
  super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.memory_types_.
  super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0.memory_types_.
  super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.global_types_.
  super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.global_types_.
  super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0.global_types_.
  super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.event_types_.
  super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b0.event_types_.
  super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0.event_types_.
  super__Vector_base<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3b0.depth_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3b0.func_fixups_.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_3b0,options);
  anon_unknown_0::BinaryReaderInterp::~BinaryReaderInterp(&local_3b0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryInterp(const void* data,
                        size_t size,
                        const ReadBinaryOptions& options,
                        Errors* errors,
                        ModuleDesc* out_module) {
  BinaryReaderInterp reader(out_module, errors, options.features);
  return ReadBinary(data, size, &reader, options);
}